

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_mult_gen(REF_INT n,REF_DBL *a,REF_DBL *b,REF_DBL *r)

{
  long lVar1;
  REF_DBL *pRVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double *pdVar7;
  double dVar8;
  
  lVar1 = (long)n;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < n) {
    uVar4 = (ulong)(uint)n;
  }
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    pRVar2 = a;
    for (uVar6 = 0; uVar6 != (uint)n; uVar6 = uVar6 + 1) {
      r[uVar3 * lVar1 + uVar6] = 0.0;
      dVar8 = 0.0;
      pdVar7 = pRVar2;
      for (uVar5 = 0; (uint)n != uVar5; uVar5 = uVar5 + 1) {
        dVar8 = dVar8 + *pdVar7 * b[uVar5];
        r[uVar3 * lVar1 + uVar6] = dVar8;
        pdVar7 = pdVar7 + lVar1;
      }
      pRVar2 = pRVar2 + 1;
    }
    b = b + lVar1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_mult_gen(REF_INT n, REF_DBL *a, REF_DBL *b,
                                       REF_DBL *r) {
  REF_INT i, j, k;

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) {
      r[i + j * n] = 0.0;
      for (k = 0; k < n; k++) r[i + j * n] += a[i + k * n] * b[k + j * n];
    }
  return REF_SUCCESS;
}